

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformFloat
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program,string *name)

{
  deUint32 dVar1;
  GLchar *name_00;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  string local_1d8;
  MessageBuilder local_1a8;
  GLfloat local_28;
  GLint local_24;
  GLfloat floatVar;
  GLint floatLoc;
  string *name_local;
  ShaderProgram *program_local;
  ProgramBinaryUniformResetCase *this_local;
  
  _floatVar = name;
  name_local = (string *)program;
  program_local = (ShaderProgram *)this;
  dVar1 = glu::ShaderProgram::getProgram(program);
  name_00 = (GLchar *)std::__cxx11::string::c_str();
  local_24 = glu::CallLogWrapper::glGetUniformLocation
                       (&(this->super_ProgramBinaryCase).super_CallLogWrapper,dVar1,name_00);
  local_28 = -1.0;
  dVar1 = glu::ShaderProgram::getProgram((ShaderProgram *)name_local);
  glu::CallLogWrapper::glGetUniformfv
            (&(this->super_ProgramBinaryCase).super_CallLogWrapper,dVar1,local_24,&local_28);
  if ((local_28 != 0.0) || (NAN(local_28))) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [31])"Fail, expected zero value for ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,_floatVar);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])", received: ");
    de::toString<float>(&local_1d8,&local_28);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d8);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_1d8);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Uniform value not reset");
  }
  return;
}

Assistant:

void verifyUniformFloat (glu::ShaderProgram& program, const std::string& name)
	{
		const GLint	floatLoc	= glGetUniformLocation(program.getProgram(), name.c_str());
		GLfloat		floatVar	= -1;

		glGetUniformfv(program.getProgram(), floatLoc, &floatVar);

		if (floatVar != 0.0f)
		{
			m_testCtx.getLog() << TestLog::Message << "Fail, expected zero value for " << name << ", received: " << de::toString(floatVar) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Uniform value not reset");
		}
	}